

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

bool __thiscall Glucose::Solver::addClause_(Solver *this,vec<Glucose::Lit> *ps)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  CRef CVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  lbool local_4d;
  CRef cr;
  vec<Glucose::Lit> oc;
  
  if (this->ok == true) {
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(ps);
    oc.data = (Lit *)0x0;
    oc.sz = 0;
    oc.cap = 0;
    bVar10 = true;
    if (this->certifiedUNSAT == true) {
      lVar8 = 0;
      bVar10 = false;
      for (lVar9 = 0; lVar9 < ps->sz; lVar9 = lVar9 + 1) {
        vec<Glucose::Lit>::push(&oc,(Lit *)((long)&ps->data->x + lVar8));
        iVar7 = *(int *)((long)&ps->data->x + lVar8);
        cr = CONCAT31(cr._1_3_,(byte)iVar7 & 1 ^ (this->assigns).data[iVar7 >> 1].value);
        bVar2 = lbool::operator==((lbool *)&cr,(lbool)0x0);
        if ((bVar2) || (iVar7 = *(int *)((long)&ps->data->x + lVar8), iVar7 == -1)) {
LAB_0010e725:
          bVar10 = true;
        }
        else {
          local_4d.value = (byte)iVar7 & 1 ^ (this->assigns).data[iVar7 >> 1].value;
          bVar2 = lbool::operator==(&local_4d,(lbool)0x1);
          if (bVar2) goto LAB_0010e725;
        }
        lVar8 = lVar8 + 4;
      }
      bVar10 = !bVar10;
    }
    uVar3 = 0xfffffffe;
    iVar7 = 0;
    for (lVar8 = 0; lVar8 < ps->sz; lVar8 = lVar8 + 1) {
      iVar1 = ps->data[lVar8].x;
      cr = CONCAT31(cr._1_3_,(byte)iVar1 & 1 ^ (this->assigns).data[iVar1 >> 1].value);
      bVar2 = lbool::operator==((lbool *)&cr,(lbool)0x0);
      if ((bVar2) || (uVar6 = ps->data[lVar8].x, (uVar6 ^ uVar3) == 1)) goto LAB_0010e9cf;
      cr = CONCAT31(cr._1_3_,(byte)uVar6 & 1 ^ (this->assigns).data[(int)uVar6 >> 1].value);
      bVar2 = lbool::operator!=((lbool *)&cr,(lbool)0x1);
      if (bVar2) {
        uVar6 = ps->data[lVar8].x;
        if (uVar6 != uVar3) {
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          ps->data[lVar9].x = uVar6;
          uVar3 = uVar6;
        }
      }
    }
    vec<Glucose::Lit>::shrink(ps,(int)lVar8 - iVar7);
    if ((!bVar10) && (this->certifiedUNSAT == true)) {
      if (this->vbyte == false) {
        for (lVar8 = 0; lVar8 < ps->sz; lVar8 = lVar8 + 1) {
          uVar3 = ps->data[lVar8].x;
          uVar5 = (int)uVar3 >> 1;
          uVar6 = ~uVar5;
          if ((uVar3 & 1) == 0) {
            uVar6 = uVar5 + 1;
          }
          fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar6);
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
        fwrite("d ",2,1,(FILE *)this->certifiedOutput);
        lVar8 = 0;
        while( true ) {
          if (oc.sz <= lVar8) break;
          uVar6 = oc.data[lVar8].x >> 1;
          uVar3 = ~uVar6;
          if ((oc.data[lVar8].x & 1U) == 0) {
            uVar3 = uVar6 + 1;
          }
          fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar3);
          lVar8 = lVar8 + 1;
        }
        fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
      }
      else {
        write_char(this,'a');
        for (lVar8 = 0; lVar8 < ps->sz; lVar8 = lVar8 + 1) {
          write_lit(this,ps->data[lVar8].x + 2);
        }
        write_lit(this,0);
        write_char(this,'d');
        for (lVar8 = 0; lVar8 < oc.sz; lVar8 = lVar8 + 1) {
          write_lit(this,oc.data[lVar8].x + 2);
        }
        write_lit(this,0);
      }
    }
    if (ps->sz == 1) {
      uncheckedEnqueue(this,(Lit)ps->data->x,0xffffffff);
      CVar4 = propagate(this);
      bVar10 = CVar4 == 0xffffffff;
      this->ok = bVar10;
    }
    else if (ps->sz == 0) {
      this->ok = false;
      bVar10 = false;
    }
    else {
      cr = ClauseAllocator::alloc<Glucose::vec<Glucose::Lit>>(&this->ca,ps,false,false);
      vec<unsigned_int>::push(&this->clauses,&cr);
      attachClause(this,cr);
LAB_0010e9cf:
      bVar10 = true;
    }
    vec<Glucose::Lit>::~vec(&oc);
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool Solver::addClause_(vec <Lit> &ps) {

    assert(decisionLevel() == 0);
    if(!ok) return false;

    // Check if clause is satisfied and remove false/duplicate literals:
    sort(ps);

    vec <Lit> oc;
    oc.clear();

    Lit p;
    int i, j, flag = 0;
    if(certifiedUNSAT) {
        for(i = j = 0, p = lit_Undef; i < ps.size(); i++) {
            oc.push(ps[i]);
            if(value(ps[i]) == l_True || ps[i] == ~p || value(ps[i]) == l_False)
                flag = 1;
        }
    }

    for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
        if(value(ps[i]) == l_True || ps[i] == ~p)
            return true;
        else if(value(ps[i]) != l_False && ps[i] != p)
            ps[j++] = p = ps[i];
    ps.shrink(i - j);

    if(flag && (certifiedUNSAT)) {
        if(vbyte) {
            write_char('a');
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                write_lit(2 * (var(ps[i]) + 1) + sign(ps[i]));
            write_lit(0);

            write_char('d');
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                write_lit(2 * (var(oc[i]) + 1) + sign(oc[i]));
            write_lit(0);
        }
        else {
            for(i = j = 0, p = lit_Undef; i < ps.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(ps[i]) + 1) * (-2 * sign(ps[i]) + 1));
            fprintf(certifiedOutput, "0\n");

            fprintf(certifiedOutput, "d ");
            for(i = j = 0, p = lit_Undef; i < oc.size(); i++)
                fprintf(certifiedOutput, "%i ", (var(oc[i]) + 1) * (-2 * sign(oc[i]) + 1));
            fprintf(certifiedOutput, "0\n");
        }
    }


    if(ps.size() == 0)
        return ok = false;
    else if(ps.size() == 1) {
        uncheckedEnqueue(ps[0]);
        return ok = (propagate() == CRef_Undef);
    } else {
        CRef cr = ca.alloc(ps, false);
        clauses.push(cr);
        attachClause(cr);
    }

    return true;
}